

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapUICommand.cxx
# Opt level: O3

bool cmQTWrapUICommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  pointer pcVar3;
  long *plVar4;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var5;
  undefined8 uVar6;
  ulong uVar7;
  pointer pbVar8;
  bool bVar9;
  string *psVar10;
  cmSourceFile *this;
  string *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer pbVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  string_view value;
  string_view value_00;
  __single_object cc;
  string sourceListValue;
  string headerListValue;
  string uiName;
  string hName;
  string mocName;
  string cxxName;
  string srcName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines mocCommandLines;
  cmCustomCommandLines cxxCommandLines;
  cmCustomCommandLines hCommandLines;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_328;
  long *local_320;
  size_t local_318;
  long local_310 [2];
  long *local_300;
  size_t local_2f8;
  long local_2f0 [2];
  cmMakefile *local_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  pointer local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a0;
  size_type local_298;
  pointer local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  value_type local_278;
  string local_258;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_238;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_230;
  string local_228;
  string local_1f8;
  string local_1d8;
  ulong local_1b8;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_1b0;
  string local_1a8;
  string local_188;
  string local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string *local_130;
  string *local_128;
  string *local_120;
  string *local_118;
  string *local_110;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_108;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_f0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_d8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_1b8 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  local_2d8._M_unused._M_object = &local_2c8;
  if (local_1b8 < 0x61) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    uVar7 = local_1b8;
    local_1b8 = uVar7;
    if ((code **)local_2d8._M_unused._0_8_ != &local_2c8) {
      operator_delete(local_2d8._M_unused._M_object,(ulong)(local_2c8 + 1));
      local_1b8 = uVar7;
    }
  }
  else {
    pcVar1 = status->Makefile;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"QT_UIC_EXECUTABLE","");
    psVar10 = cmMakefile::GetRequiredDefinition(pcVar1,(string *)&local_2d8);
    if ((code **)local_2d8._M_unused._0_8_ != &local_2c8) {
      operator_delete(local_2d8._M_unused._M_object,(ulong)(local_2c8 + 1));
    }
    local_2d8._M_unused._M_object = &local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"QT_MOC_EXECUTABLE","");
    local_120 = cmMakefile::GetRequiredDefinition(pcVar1,(string *)&local_2d8);
    if ((code **)local_2d8._M_unused._0_8_ != &local_2c8) {
      operator_delete(local_2d8._M_unused._M_object,(ulong)(local_2c8 + 1));
    }
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_130 = pbVar2 + 1;
    psVar11 = pbVar2 + 2;
    local_118 = psVar10;
    psVar10 = cmMakefile::GetSafeDefinition(pcVar1,local_130);
    local_300 = local_2f0;
    pcVar3 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,pcVar3,pcVar3 + psVar10->_M_string_length);
    local_2e0 = pcVar1;
    local_128 = psVar11;
    psVar10 = cmMakefile::GetSafeDefinition(pcVar1,psVar11);
    local_320 = local_310;
    pcVar3 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar3,pcVar3 + psVar10->_M_string_length);
    local_110 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    psVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 3;
    if (psVar10 != local_110) {
      do {
        this = cmMakefile::GetSource(local_2e0,psVar10,Ambiguous);
        if (this == (cmSourceFile *)0x0) {
LAB_002349dd:
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1d8,psVar10);
          psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_2e0);
          local_2d8._8_8_ = (psVar11->_M_dataplus)._M_p;
          local_2d8._M_unused._0_8_ = (undefined8)psVar11->_M_string_length;
          local_228._M_dataplus._M_p = (pointer)0x1;
          paStack_2c0 = &local_228.field_2;
          local_228.field_2._M_local_buf[0] = '/';
          local_2c8 = (code *)0x1;
          local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_string_length;
          local_2b0 = local_1d8._M_dataplus._M_p;
          local_2a8 = 2;
          local_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x6a9457;
          views._M_len = 4;
          views._M_array = (iterator)&local_2d8;
          local_228._M_string_length = (size_type)paStack_2c0;
          cmCatViews_abi_cxx11_(&local_258,views);
          psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_2e0);
          local_2d8._8_8_ = (psVar11->_M_dataplus)._M_p;
          local_2d8._M_unused._0_8_ = (undefined8)psVar11->_M_string_length;
          local_228._M_dataplus._M_p = (pointer)0x1;
          paStack_2c0 = &local_228.field_2;
          local_228.field_2._M_local_buf[0] = '/';
          local_2c8 = (code *)0x1;
          local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_string_length;
          local_2b0 = local_1d8._M_dataplus._M_p;
          local_2a8 = 4;
          local_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x6b18f5;
          views_00._M_len = 4;
          views_00._M_array = (iterator)&local_2d8;
          local_228._M_string_length = (size_type)paStack_2c0;
          cmCatViews_abi_cxx11_(&local_1f8,views_00);
          psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_2e0);
          local_2d8._8_8_ = (psVar11->_M_dataplus)._M_p;
          local_2d8._M_unused._0_8_ = (undefined8)psVar11->_M_string_length;
          local_2c8 = (code *)0x5;
          paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x68e014;
          local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_string_length;
          local_2b0 = local_1d8._M_dataplus._M_p;
          local_2a8 = 4;
          local_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x6b18f5;
          views_01._M_len = 4;
          views_01._M_array = (iterator)&local_2d8;
          cmCatViews_abi_cxx11_(&local_228,views_01);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          local_278._M_string_length = 0;
          local_278.field_2._M_local_buf[0] = '\0';
          bVar9 = cmsys::SystemTools::FileIsFullPath(psVar10);
          if (bVar9) {
            std::__cxx11::string::_M_assign((string *)&local_278);
          }
          else {
            if ((this == (cmSourceFile *)0x0) ||
               (bVar9 = cmSourceFile::GetIsGenerated(this,GlobalAndLocal), !bVar9)) {
              cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_2e0);
            }
            else {
              cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_2e0);
            }
            std::__cxx11::string::_M_assign((string *)&local_278);
            std::__cxx11::string::append((char *)&local_278);
            std::__cxx11::string::_M_append((char *)&local_278,(ulong)(psVar10->_M_dataplus)._M_p);
          }
          if (local_2f8 != 0) {
            std::__cxx11::string::append((char *)&local_300);
          }
          std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_258._M_dataplus._M_p);
          if (local_318 != 0) {
            std::__cxx11::string::append((char *)&local_320);
          }
          std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_1f8._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_320);
          std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_228._M_dataplus._M_p);
          psVar11 = local_118;
          local_2d8._8_8_ = (local_118->_M_dataplus)._M_p;
          local_2d8._M_unused._0_8_ = (undefined8)local_118->_M_string_length;
          local_2c8 = (code *)0x2;
          paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x6821d2;
          local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_string_length;
          local_2b0 = local_258._M_dataplus._M_p;
          local_2a8 = local_278._M_string_length;
          local_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_dataplus._M_p;
          ilist._M_len = 4;
          ilist._M_array = (iterator)&local_2d8;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_d8,ilist);
          local_2d8._8_8_ = (psVar11->_M_dataplus)._M_p;
          local_2d8._M_unused._0_8_ = (undefined8)psVar11->_M_string_length;
          local_2c8 = (code *)0x5;
          paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x68e03c;
          local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_string_length;
          local_2b0 = local_258._M_dataplus._M_p;
          local_2a8 = 2;
          local_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x6821d2;
          local_298 = local_1f8._M_string_length;
          local_290 = local_1f8._M_dataplus._M_p;
          local_288 = local_278._M_string_length;
          local_280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_dataplus._M_p;
          ilist_00._M_len = 6;
          ilist_00._M_array = (iterator)&local_2d8;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_f0,ilist_00);
          local_2d8._8_8_ = (local_120->_M_dataplus)._M_p;
          local_2d8._M_unused._0_8_ = (undefined8)local_120->_M_string_length;
          local_2c8 = (code *)0x2;
          paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x6821d2;
          local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_228._M_string_length;
          local_2b0 = local_228._M_dataplus._M_p;
          local_2a8 = local_258._M_string_length;
          local_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_dataplus._M_p;
          ilist_01._M_len = 4;
          ilist_01._M_array = (iterator)&local_2d8;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_108,ilist_01);
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_148,&local_278);
          std::make_unique<cmCustomCommand>();
          _Var5._M_head_impl = local_328._M_head_impl;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,local_258._M_dataplus._M_p,
                     local_258._M_dataplus._M_p + local_258._M_string_length);
          cmCustomCommand::SetOutputs(_Var5._M_head_impl,&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          _Var5._M_head_impl = local_328._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_148);
          cmCustomCommand::SetDepends(_Var5._M_head_impl,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Var5._M_head_impl = local_328._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_60,&local_d8);
          cmCustomCommand::SetCommandLines(_Var5._M_head_impl,(cmCustomCommandLines *)&local_60);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_60)
          ;
          local_230._M_head_impl = local_328._M_head_impl;
          local_328._M_head_impl = (cmCustomCommand *)0x0;
          local_2c8 = (code *)0x0;
          paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
          local_2d8._M_unused._M_object = (cmCustomCommand *)0x0;
          local_2d8._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (local_2e0,
                     (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_230,(CommandSourceCallback *)&local_2d8,false);
          if (local_2c8 != (code *)0x0) {
            (*local_2c8)(&local_2d8,&local_2d8,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_230);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_148,&local_258);
          std::make_unique<cmCustomCommand>();
          uVar6 = local_2d8._M_unused._0_8_;
          _Var5._M_head_impl = local_328._M_head_impl;
          local_2d8._M_unused._M_object = (void *)0x0;
          local_328._M_head_impl = (cmCustomCommand *)uVar6;
          if (_Var5._M_head_impl != (cmCustomCommand *)0x0) {
            cmCustomCommand::~cmCustomCommand(_Var5._M_head_impl);
            operator_delete(_Var5._M_head_impl,0x138);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_2d8);
          _Var5._M_head_impl = local_328._M_head_impl;
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_188,local_1f8._M_dataplus._M_p,
                     local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
          cmCustomCommand::SetOutputs(_Var5._M_head_impl,&local_188);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          _Var5._M_head_impl = local_328._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_78,&local_148);
          cmCustomCommand::SetDepends(_Var5._M_head_impl,&local_78);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
          _Var5._M_head_impl = local_328._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_90,&local_f0);
          cmCustomCommand::SetCommandLines(_Var5._M_head_impl,(cmCustomCommandLines *)&local_90);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_90)
          ;
          local_238._M_head_impl = local_328._M_head_impl;
          local_328._M_head_impl = (cmCustomCommand *)0x0;
          local_2c8 = (code *)0x0;
          paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
          local_2d8._M_unused._M_object = (cmCustomCommand *)0x0;
          local_2d8._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (local_2e0,
                     (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_238,(CommandSourceCallback *)&local_2d8,false);
          if (local_2c8 != (code *)0x0) {
            (*local_2c8)(&local_2d8,&local_2d8,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_238);
          pbVar8 = local_148.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar2 = local_148.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_148.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_148.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar12 = &(local_148.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar12 + -1))->_M_dataplus)._M_p;
              if (paVar12 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar4) {
                operator_delete(plVar4,paVar12->_M_allocated_capacity + 1);
              }
              pbVar13 = (pointer)(paVar12 + 1);
              paVar12 = paVar12 + 2;
            } while (pbVar13 != pbVar8);
            local_148.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_148,&local_258);
          std::make_unique<cmCustomCommand>();
          uVar6 = local_2d8._M_unused._0_8_;
          _Var5._M_head_impl = local_328._M_head_impl;
          local_2d8._M_unused._M_object = (void *)0x0;
          local_328._M_head_impl = (cmCustomCommand *)uVar6;
          if (_Var5._M_head_impl != (cmCustomCommand *)0x0) {
            cmCustomCommand::~cmCustomCommand(_Var5._M_head_impl);
            operator_delete(_Var5._M_head_impl,0x138);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_2d8);
          _Var5._M_head_impl = local_328._M_head_impl;
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,local_228._M_dataplus._M_p,
                     (char *)(local_228._M_string_length + (long)local_228._M_dataplus._M_p));
          cmCustomCommand::SetOutputs(_Var5._M_head_impl,&local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          _Var5._M_head_impl = local_328._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_a8,&local_148);
          cmCustomCommand::SetDepends(_Var5._M_head_impl,&local_a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8);
          _Var5._M_head_impl = local_328._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_c0,&local_108);
          cmCustomCommand::SetCommandLines(_Var5._M_head_impl,(cmCustomCommandLines *)&local_c0);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_c0)
          ;
          local_1b0._M_head_impl = local_328._M_head_impl;
          local_328._M_head_impl = (cmCustomCommand *)0x0;
          local_2c8 = (code *)0x0;
          paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
          local_2d8._M_unused._M_object = (code **)0x0;
          local_2d8._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (local_2e0,
                     (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_1b0,(CommandSourceCallback *)&local_2d8,false);
          if (local_2c8 != (code *)0x0) {
            (*local_2c8)(&local_2d8,&local_2d8,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_1b0);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_328);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_148);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                    (&local_108);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_f0)
          ;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_d8)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,
                            CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                     local_278.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,
                            CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                     local_228.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_2d8._M_unused._M_object = &local_2c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"WRAP_EXCLUDE","");
          bVar9 = cmSourceFile::GetPropertyAsBool(this,(string *)&local_2d8);
          if ((code **)local_2d8._M_unused._0_8_ != &local_2c8) {
            operator_delete(local_2d8._M_unused._M_object,(ulong)(local_2c8 + 1));
          }
          if (!bVar9) goto LAB_002349dd;
        }
        psVar10 = psVar10 + 1;
      } while (psVar10 != local_110);
    }
    pcVar1 = local_2e0;
    value._M_str = (char *)local_320;
    value._M_len = local_318;
    cmMakefile::AddDefinition(local_2e0,local_128,value);
    value_00._M_str = (char *)local_300;
    value_00._M_len = local_2f8;
    cmMakefile::AddDefinition(pcVar1,local_130,value_00);
    if (local_320 != local_310) {
      operator_delete(local_320,local_310[0] + 1);
    }
    if (local_300 != local_2f0) {
      operator_delete(local_300,local_2f0[0] + 1);
    }
  }
  return 0x60 < local_1b8;
}

Assistant:

bool cmQTWrapUICommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the uic and moc executables to run in the custom commands.
  std::string const& uic_exe = mf.GetRequiredDefinition("QT_UIC_EXECUTABLE");
  std::string const& moc_exe = mf.GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& headerList = args[1];
  std::string const& sourceList = args[2];
  std::string headerListValue = mf.GetSafeDefinition(headerList);
  std::string sourceListValue = mf.GetSafeDefinition(sourceList);

  // Create rules for all sources listed.
  for (std::string const& arg : cmMakeRange(args).advance(3)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should wrap the class
    if (!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE"))) {
      // Compute the name of the files to generate.
      std::string srcName =
        cmSystemTools::GetFilenameWithoutLastExtension(arg);
      std::string hName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), '/', srcName, ".h");
      std::string cxxName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), '/', srcName, ".cxx");
      std::string mocName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), "/moc_", srcName, ".cxx");

      // Compute the name of the ui file from which to generate others.
      std::string uiName;
      if (cmSystemTools::FileIsFullPath(arg)) {
        uiName = arg;
      } else {
        if (curr && curr->GetIsGenerated()) {
          uiName = mf.GetCurrentBinaryDirectory();
        } else {
          uiName = mf.GetCurrentSourceDirectory();
        }
        uiName += "/";
        uiName += arg;
      }

      // create the list of headers
      if (!headerListValue.empty()) {
        headerListValue += ";";
      }
      headerListValue += hName;

      // create the list of sources
      if (!sourceListValue.empty()) {
        sourceListValue += ";";
      }
      sourceListValue += cxxName;
      sourceListValue += ";";
      sourceListValue += mocName;

      // set up .ui to .h and .cxx command
      cmCustomCommandLines hCommandLines =
        cmMakeSingleCommandLine({ uic_exe, "-o", hName, uiName });
      cmCustomCommandLines cxxCommandLines = cmMakeSingleCommandLine(
        { uic_exe, "-impl", hName, "-o", cxxName, uiName });
      cmCustomCommandLines mocCommandLines =
        cmMakeSingleCommandLine({ moc_exe, "-o", mocName, hName });

      std::vector<std::string> depends;
      depends.push_back(uiName);
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(hName);
      cc->SetDepends(depends);
      cc->SetCommandLines(hCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));

      depends.push_back(hName);
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(cxxName);
      cc->SetDepends(depends);
      cc->SetCommandLines(cxxCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));

      depends.clear();
      depends.push_back(hName);
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(mocName);
      cc->SetDepends(depends);
      cc->SetCommandLines(mocCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));
    }
  }

  // Store the final list of source files and headers.
  mf.AddDefinition(sourceList, sourceListValue);
  mf.AddDefinition(headerList, headerListValue);
  return true;
}